

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O2

void * list_remove(List *list,uint index)

{
  uint uVar1;
  list_node_ *plVar2;
  list_node_ *plVar3;
  void *pvVar4;
  ListNode *__ptr;
  
  uVar1 = list->size;
  if ((uVar1 <= index) || (__ptr = list_get_(list,index), __ptr == (ListNode *)0x0)) {
    return (void *)0x0;
  }
  if (index == 0) {
    list->head = __ptr->next;
  }
  else {
    if (uVar1 - 1 == index) {
      plVar2 = __ptr->prev;
      list->tail = plVar2;
      plVar2->next = (list_node_ *)0x0;
      goto LAB_00102be6;
    }
    plVar2 = __ptr->prev;
    plVar3 = __ptr->next;
    plVar2->next = plVar3;
    plVar3->prev = plVar2;
  }
  index = uVar1 - 1;
LAB_00102be6:
  list->size = index;
  pvVar4 = __ptr->data;
  free(__ptr);
  if (list->size != 0) {
    return pvVar4;
  }
  list->head = (ListNode *)0x0;
  list->tail = (ListNode *)0x0;
  return pvVar4;
}

Assistant:

void* list_remove(List * list, unsigned int index){
    if (index >= list->size){
        return NULL;
    }
    ListNode *node = list_get_(list, index);
    if (node == NULL)
        return NULL;
    if (index == 0){
        /**
         * 删除头
         */
        list->head = node->next;
    }else if (index == list->size - 1){
        // 删除尾
        list->tail = node->prev;
        node->prev->next = NULL;
    }else{
        node->prev->next = node->next;
        node->next->prev = node->prev;
    }
    list->size --;
    void* data = node->data;
    free(node);
    // 防止出现野指针
    if (list->size == 0){
        list->head = list->tail = NULL;
    }
    return data;
}